

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::TParseContext::vkRelaxedRemapFunctionCall
          (TParseContext *this,TSourceLoc *loc,TFunction *function,TIntermNode *arguments)

{
  TIntermediate *pTVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TParameter *pTVar4;
  TIntermConstantUnion *pTVar5;
  TIntermAggregate *pTVar6;
  TIntermTyped *left;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  TParameter local_528;
  undefined1 local_510 [8];
  TParameter tmpP_1;
  uint local_4dc;
  undefined1 local_4d8 [4];
  int i_1;
  TFunction realFunc_1;
  TType uintType_1;
  undefined1 local_2d8 [8];
  TString name_1;
  undefined1 local_298 [8];
  TParameter tmpP;
  uint local_264;
  undefined1 local_260 [4];
  int i;
  TFunction realFunc;
  TType uintType;
  undefined1 local_60 [8];
  TString name;
  TIntermTyped *result;
  TIntermNode *arguments_local;
  TFunction *function_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  name.field_2._8_8_ = 0;
  iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0x1b])();
  if (iVar3 == 0) {
    iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[3])();
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)CONCAT44(extraout_var,iVar3),"atomicCounterIncrement");
    if (bVar2) {
      pool_allocator<char>::pool_allocator((pool_allocator<char> *)&uintType.spirvType);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)local_60
                 ,"atomicAdd",(pool_allocator<char> *)&uintType.spirvType);
      TType::TType((TType *)&realFunc.linkType,EbtUint,EvqTemporary,1,0,0,false);
      iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])();
      TFunction::TFunction
                ((TFunction *)local_260,(TString *)local_60,(TType *)CONCAT44(extraout_var_00,iVar3)
                 ,EOpNull);
      for (local_264 = 0; iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(),
          (int)local_264 < iVar3; local_264 = local_264 + 1) {
        memset(&tmpP.defaultValue,0,0x18);
        iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,(ulong)local_264);
        pTVar4 = TParameter::copyParam
                           ((TParameter *)&tmpP.defaultValue,
                            (TParameter *)CONCAT44(extraout_var_01,iVar3));
        TFunction::addParameter((TFunction *)local_260,pTVar4);
      }
      local_298 = (undefined1  [8])0x0;
      tmpP.name = (TString *)&realFunc.linkType;
      tmpP.type = (TType *)0x0;
      memset((void *)((long)&name_1.field_2 + 8),0,0x18);
      pTVar4 = TParameter::copyParam
                         ((TParameter *)((long)&name_1.field_2 + 8),(TParameter *)local_298);
      TFunction::addParameter((TFunction *)local_260,pTVar4);
      pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      pTVar5 = TIntermediate::addConstantUnion
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate,1,loc,
                          true);
      pTVar6 = TIntermediate::growAggregate(pTVar1,arguments,(TIntermNode *)pTVar5);
      name.field_2._8_8_ = handleFunctionCall(this,loc,(TFunction *)local_260,(TIntermNode *)pTVar6)
      ;
      TFunction::~TFunction((TFunction *)local_260);
      TType::~TType((TType *)&realFunc.linkType);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    local_60);
    }
    else {
      iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[3])();
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)CONCAT44(extraout_var_02,iVar3),"atomicCounterDecrement");
      if (bVar2) {
        pool_allocator<char>::pool_allocator((pool_allocator<char> *)&uintType_1.spirvType);
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   local_2d8,"atomicAdd",(pool_allocator<char> *)&uintType_1.spirvType);
        TType::TType((TType *)&realFunc_1.linkType,EbtUint,EvqTemporary,1,0,0,false);
        iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])();
        TFunction::TFunction
                  ((TFunction *)local_4d8,(TString *)local_2d8,
                   (TType *)CONCAT44(extraout_var_03,iVar3),EOpNull);
        for (local_4dc = 0; iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(),
            (int)local_4dc < iVar3; local_4dc = local_4dc + 1) {
          memset(&tmpP_1.defaultValue,0,0x18);
          iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,(ulong)local_4dc);
          pTVar4 = TParameter::copyParam
                             ((TParameter *)&tmpP_1.defaultValue,
                              (TParameter *)CONCAT44(extraout_var_04,iVar3));
          TFunction::addParameter((TFunction *)local_4d8,pTVar4);
        }
        local_510 = (undefined1  [8])0x0;
        tmpP_1.name = (TString *)&realFunc_1.linkType;
        tmpP_1.type = (TType *)0x0;
        memset(&local_528,0,0x18);
        pTVar4 = TParameter::copyParam(&local_528,(TParameter *)local_510);
        TFunction::addParameter((TFunction *)local_4d8,pTVar4);
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        pTVar5 = TIntermediate::addConstantUnion
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,-1,loc
                            ,true);
        pTVar6 = TIntermediate::growAggregate(pTVar1,arguments,(TIntermNode *)pTVar5);
        left = handleFunctionCall(this,loc,(TFunction *)local_4d8,(TIntermNode *)pTVar6);
        name.field_2._8_8_ = left;
        if (left != (TIntermTyped *)0x0) {
          pTVar5 = TIntermediate::addConstantUnion
                             ((this->super_TParseContextBase).super_TParseVersions.intermediate,1,
                              loc,true);
          name.field_2._8_8_ =
               handleBinaryMath(this,loc,"-",EOpSub,left,&pTVar5->super_TIntermTyped);
        }
        TFunction::~TFunction((TFunction *)local_4d8);
        TType::~TType((TType *)&realFunc_1.linkType);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      local_2d8);
      }
      else {
        iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[3])();
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)CONCAT44(extraout_var_05,iVar3),"atomicCounter");
        if (((bVar2) && (arguments != (TIntermNode *)0x0)) &&
           (iVar3 = (*arguments->_vptr_TIntermNode[3])(), CONCAT44(extraout_var_06,iVar3) != 0)) {
          iVar3 = (*arguments->_vptr_TIntermNode[3])();
          name.field_2._8_8_ = CONCAT44(extraout_var_07,iVar3);
        }
      }
    }
    this_local = (TParseContext *)name.field_2._8_8_;
  }
  else {
    this_local = (TParseContext *)0x0;
  }
  return (TIntermTyped *)this_local;
}

Assistant:

TIntermTyped* TParseContext::vkRelaxedRemapFunctionCall(const TSourceLoc& loc, TFunction* function, TIntermNode* arguments)
{
    TIntermTyped* result = nullptr;

    if (function->getBuiltInOp() != EOpNull) {
        return nullptr;
    }

    if (function->getName() == "atomicCounterIncrement") {
        // change atomicCounterIncrement into an atomicAdd of 1
        TString name("atomicAdd");
        TType uintType(EbtUint);

        TFunction realFunc(&name, function->getType());

        // Use copyParam to avoid shared ownership of the 'type' field
        // of the parameter.
        for (int i = 0; i < function->getParamCount(); ++i) {
            realFunc.addParameter(TParameter().copyParam((*function)[i]));
        }

        TParameter tmpP = { nullptr, &uintType, {} };
        realFunc.addParameter(TParameter().copyParam(tmpP));
        arguments = intermediate.growAggregate(arguments, intermediate.addConstantUnion(1, loc, true));

        result = handleFunctionCall(loc, &realFunc, arguments);
    } else if (function->getName() == "atomicCounterDecrement") {
        // change atomicCounterDecrement into an atomicAdd with -1
        // and subtract 1 from result, to return post-decrement value
        TString name("atomicAdd");
        TType uintType(EbtUint);

        TFunction realFunc(&name, function->getType());

        for (int i = 0; i < function->getParamCount(); ++i) {
            realFunc.addParameter(TParameter().copyParam((*function)[i]));
        }

        TParameter tmpP = { nullptr, &uintType, {} };
        realFunc.addParameter(TParameter().copyParam(tmpP));
        arguments = intermediate.growAggregate(arguments, intermediate.addConstantUnion(-1, loc, true));

        result = handleFunctionCall(loc, &realFunc, arguments);

        // post decrement, so that it matches AtomicCounterDecrement semantics
        if (result) {
            result = handleBinaryMath(loc, "-", EOpSub, result, intermediate.addConstantUnion(1, loc, true));
        }
    } else if (function->getName() == "atomicCounter") {
        // change atomicCounter into a direct read of the variable
        if (arguments && arguments->getAsTyped()) {
            result = arguments->getAsTyped();
        }
    }

    return result;
}